

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O0

int Scl_CommandTopo(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  int fVerbose;
  int c;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar2 == -1) {
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar2 = Abc_NtkIsLogic(pAVar3);
        if (iVar2 == 0) {
          Abc_Print(-1,"This command can only be applied to a logic network.\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          pAVar3 = Abc_NtkDupDfs(pAVar3);
          if (pAVar3 == (Abc_Ntk_t *)0x0) {
            Abc_Print(-1,"The command has failed.\n");
            pAbc_local._4_4_ = 1;
          }
          else {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
            pAbc_local._4_4_ = 0;
          }
        }
      }
      return pAbc_local._4_4_;
    }
    if ((iVar2 == 0x68) || (iVar2 != 0x76)) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  fprintf((FILE *)pAbc->Err,"usage: topo [-vh]\n");
  fprintf((FILE *)pAbc->Err,"\t           rearranges nodes to be in a topological order\n");
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
          pcVar4);
  fprintf((FILE *)pAbc->Err,"\t-h       : print the command usage\n");
  return 1;
}

Assistant:

int Scl_CommandTopo( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Ntk_t * pNtkRes;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }

    // modify the current network
    pNtkRes = Abc_NtkDupDfs( pNtk );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: topo [-vh]\n" );
    fprintf( pAbc->Err, "\t           rearranges nodes to be in a topological order\n" );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the command usage\n");
    return 1;
}